

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O2

uint8_t * __thiscall
cdnsBlock::parse_map_item(cdnsBlock *this,uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  uint8_t *puVar1;
  char *pcVar2;
  
  switch(val) {
  case 0:
    puVar1 = cdns_block_preamble::parse(&this->preamble,in,in_max,err,this);
    break;
  case 1:
    puVar1 = cdns_block_statistics::parse(&this->statistics,in,in_max,err,this);
    break;
  case 2:
    puVar1 = cdnsBlockTables::parse(&this->tables,in,in_max,err,this);
    break;
  case 3:
    puVar1 = cbor_ctx_array_parse<cdns_query,cdnsBlock>(in,in_max,&this->queries,err,this);
    break;
  case 4:
    puVar1 = cbor_ctx_array_parse<cdns_address_event_count,cdnsBlock>
                       (in,in_max,&this->address_events,err,this);
    break;
  default:
    puVar1 = cbor_skip(in,in_max,err);
  }
  if (puVar1 == (uint8_t *)0x0) {
    if ((ulong)val < 5) {
      pcVar2 = &DAT_0016d4bc + *(int *)(&DAT_0016d4bc + val * 4);
    }
    else {
      pcVar2 = "unknown";
    }
    fprintf(_stderr,"Cannot parse block element %d (%s), err=%d\n",val & 0xffffffff,pcVar2,
            (ulong)(uint)*err);
  }
  return puVar1;
}

Assistant:

uint8_t* cdnsBlock::parse_map_item(uint8_t* in, uint8_t const* in_max, int64_t val, int* err)
{
    switch (val) {
    case 0: /* Block preamble */
        in = preamble.parse(in, in_max, err, this);
        break;
    case 1: /* Block statistics */
        in = statistics.parse(in, in_max, err, this);
        break;
    case 2: /* Block Tables */
        in = tables.parse(in, in_max, err, this);
        break;
    case 3: /* Block Queries */
        in = cbor_ctx_array_parse(in, in_max, &queries, err, this);
        break;
    case 4: /* Address event counts */
        in = cbor_ctx_array_parse(in, in_max, &address_events, err, this);
        break;
    default:
         in = cbor_skip(in, in_max, err);
        break;
    }

    if (in == NULL) {
        char const* e[] = { "preamble", "statistics", "tables", "queries", "address_events" };
        int nb_e = (int)sizeof(e) / sizeof(char const*);

        fprintf(stderr, "Cannot parse block element %d (%s), err=%d\n", (int)val, (val >= 0 && val < nb_e) ? e[val] : "unknown", *err);
    }
    return in;
}